

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall NLProblemBuilderTest_OnCall_Test::TestBody(NLProblemBuilderTest_OnCall_Test *this)

{
  TestFunction TVar1;
  TestCallExprBuilder func_index;
  BasicTestExpr<1> BVar2;
  MockSpec<TestCallExprBuilder_(TestFunction,_int)> *pMVar3;
  TypedExpectation<TestCallExprBuilder_(TestFunction,_int)> *this_00;
  TypedExpectation<BasicTestExpr<1>_(TestCallExprBuilder)> *pTVar4;
  TestCallExprBuilder call_builder;
  TestFunction func;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  CallArgHandler value;
  MockProblemBuilder *in_stack_fffffffffffffea0;
  Matcher<TestFunction> *in_stack_fffffffffffffea8;
  MockProblemBuilder *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffec0;
  Matcher<TestFunction> *in_stack_fffffffffffffec8;
  Matcher<int> *in_stack_fffffffffffffed0;
  TestCallExprBuilder value_00;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  BasicTestExpr<1> in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  BasicTestExpr<1> BVar5;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  TestFunction TVar6;
  undefined4 in_stack_ffffffffffffffb4;
  TestCallExprBuilder local_10;
  TestFunction local_c [3];
  
  TestFunction::TestFunction(local_c,ID);
  TestCallExprBuilder::TestCallExprBuilder(&local_10,ID);
  testing::Matcher<int>::Matcher
            (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  MockProblemBuilder::gmock_function
            (in_stack_fffffffffffffea0,
             (Matcher<int> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  testing::internal::MockSpec<TestFunction_(int)>::InternalExpectedAt
            ((MockSpec<TestFunction_(int)> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
             ,in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
             (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  TVar6.id_ = local_c[0].id_;
  TVar1.id_ = (IDType)testing::Return<TestFunction>((IDType)in_stack_fffffffffffffea0);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestFunction> *)in_stack_fffffffffffffec8);
  testing::internal::TypedExpectation<TestFunction_(int)>::WillOnce
            ((TypedExpectation<TestFunction_(int)> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20.id_),
             (Action<TestFunction_(int)> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  testing::Action<TestFunction_(int)>::~Action((Action<TestFunction_(int)> *)0x18091b);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x180928);
  testing::Matcher<TestFunction>::Matcher
            (in_stack_fffffffffffffec8,
             (TestFunction)(IDType)((ulong)in_stack_fffffffffffffed0 >> 0x20));
  testing::Matcher<int>::Matcher
            (in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  pMVar3 = MockProblemBuilder::gmock_BeginCall
                     (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                      (Matcher<int> *)in_stack_fffffffffffffea0);
  value_00.id_ = (IDType)((ulong)pMVar3 >> 0x20);
  this_00 = testing::internal::MockSpec<TestCallExprBuilder_(TestFunction,_int)>::InternalExpectedAt
                      ((MockSpec<TestCallExprBuilder_(TestFunction,_int)> *)
                       CONCAT44(TVar1.id_,TVar6.id_),in_stack_ffffffffffffffa8,
                       in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                       (char *)CONCAT44(local_c[0].id_,in_stack_ffffffffffffff90));
  func_index.id_ = (IDType)testing::Return<TestCallExprBuilder>((IDType)in_stack_fffffffffffffea0);
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<TestCallExprBuilder> *)this_00);
  testing::internal::TypedExpectation<TestCallExprBuilder_(TestFunction,_int)>::WillOnce
            ((TypedExpectation<TestCallExprBuilder_(TestFunction,_int)> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20.id_),
             (Action<TestCallExprBuilder_(TestFunction,_int)> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  testing::Action<TestCallExprBuilder_(TestFunction,_int)>::~Action
            ((Action<TestCallExprBuilder_(TestFunction,_int)> *)0x180a1b);
  testing::Matcher<int>::~Matcher((Matcher<int> *)0x180a28);
  testing::Matcher<TestFunction>::~Matcher((Matcher<TestFunction> *)0x180a35);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::BeginCall
            ((NLProblemBuilder<MockProblemBuilder> *)this_00,func_index.id_,
             in_stack_fffffffffffffec0);
  testing::Matcher<TestCallExprBuilder>::Matcher((Matcher<TestCallExprBuilder> *)this_00,value_00);
  MockProblemBuilder::gmock_EndCall
            (in_stack_fffffffffffffea0,
             (Matcher<TestCallExprBuilder> *)
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  pTVar4 = testing::internal::MockSpec<BasicTestExpr<1>_(TestCallExprBuilder)>::InternalExpectedAt
                     ((MockSpec<BasicTestExpr<1>_(TestCallExprBuilder)> *)
                      CONCAT44(TVar1.id_,TVar6.id_),in_stack_ffffffffffffffa8,
                      in_stack_ffffffffffffffa4,in_stack_ffffffffffffff98,
                      (char *)CONCAT44(local_c[0].id_,in_stack_ffffffffffffff90));
  value.id_ = (IDType)pTVar4;
  BasicTestExpr<1>::BasicTestExpr((BasicTestExpr<1> *)&stack0xffffffffffffff20,ID);
  BVar2.id_ = (IDType)testing::Return<BasicTestExpr<1>>(value.id_);
  BVar5.id_ = BVar2.id_;
  testing::internal::ReturnAction::operator_cast_to_Action
            ((ReturnAction<BasicTestExpr<1>_> *)this_00);
  testing::internal::TypedExpectation<BasicTestExpr<1>_(TestCallExprBuilder)>::WillOnce
            ((TypedExpectation<BasicTestExpr<1>_(TestCallExprBuilder)> *)
             CONCAT44(BVar5.id_,in_stack_ffffffffffffff20.id_),
             (Action<BasicTestExpr<1>_(TestCallExprBuilder)> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  testing::Action<BasicTestExpr<1>_(TestCallExprBuilder)>::~Action
            ((Action<BasicTestExpr<1>_(TestCallExprBuilder)> *)0x180b38);
  testing::Matcher<TestCallExprBuilder>::~Matcher((Matcher<TestCallExprBuilder> *)0x180b45);
  mp::internal::NLProblemBuilder<MockProblemBuilder>::EndCall
            ((NLProblemBuilder<MockProblemBuilder> *)CONCAT44(BVar2.id_,in_stack_fffffffffffffe98),
             value);
  return;
}

Assistant:

TEST_F(NLProblemBuilderTest, OnCall) {
  auto func = TestFunction(ID);
  auto call_builder = TestCallExprBuilder(ID);
  EXPECT_CALL(builder, function(42)).WillOnce(Return(func));
  EXPECT_CALL(builder, BeginCall(func, 11)).WillOnce(Return(call_builder));
  adapter.BeginCall(42, 11);
  EXPECT_CALL(builder, EndCall(call_builder)).
      WillOnce(Return(TestNumericExpr(ID)));
  adapter.EndCall(call_builder);
}